

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O0

void __thiscall BGIPSolution::Load(BGIPSolution *this,string *filename)

{
  undefined8 uVar1;
  char *in_stack_00000008;
  E *in_stack_00000010;
  
  uVar1 = __cxa_allocate_exception(0x28);
  E::E(in_stack_00000010,in_stack_00000008);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

void BGIPSolution::Load(const string& filename)
{
    throw(E("BGIPSolution::Load not yet implemented"));
#if 0
    ifstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "BGIPSolution::Load: failed to "
           << "open file " << filename << endl;
        throw E(ss);
    }

    LIndex index;
    double payoff;

    string buffer;
    getline(fp,buffer);
    istringstream is(buffer);
    is >> index;
    is >> payoff;

    SetPolicy(index);
    SetPayoff(payoff);
#endif
}